

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O2

void __thiscall Fl_Text_Display::~Fl_Text_Display(Fl_Text_Display *this)

{
  (this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget =
       (_func_int **)&PTR__Fl_Text_Display_00279660;
  if (scroll_direction != 0) {
    Fl::remove_timeout(scroll_timer_cb,this);
    scroll_direction = 0;
  }
  if (this->mBuffer != (Fl_Text_Buffer *)0x0) {
    Fl_Text_Buffer::remove_modify_callback(this->mBuffer,buffer_modified_cb,this);
    Fl_Text_Buffer::remove_predelete_callback(this->mBuffer,buffer_predelete_cb,this);
  }
  if (this->mLineStarts != (int *)0x0) {
    operator_delete__(this->mLineStarts);
  }
  Fl_Group::~Fl_Group(&this->super_Fl_Group);
  return;
}

Assistant:

Fl_Text_Display::~Fl_Text_Display() {
  if (scroll_direction) {
    Fl::remove_timeout(scroll_timer_cb, this);
    scroll_direction = 0;
  }
  if (mBuffer) {
    mBuffer->remove_modify_callback(buffer_modified_cb, this);
    mBuffer->remove_predelete_callback(buffer_predelete_cb, this);
  }
  if (mLineStarts) delete[] mLineStarts;
#if FLTK_ABI_VERSION >= 10303
  if (linenumber_format_) {
    free((void*)linenumber_format_);
    linenumber_format_ = 0;
  }
#endif
}